

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.cpp
# Opt level: O0

void verr(char *fmt,__va_list_tag *ap)

{
  int *piVar1;
  char *__s;
  __va_list_tag *ap_local;
  char *fmt_local;
  
  fprintf(_stderr,"error: ");
  vfprintf(_stderr,fmt,ap);
  fputs(": ",_stderr);
  piVar1 = __errno_location();
  __s = strerror(*piVar1);
  fputs(__s,_stderr);
  putc(10,_stderr);
  exit(1);
}

Assistant:

[[noreturn]] static void verr(char const NONNULL(fmt), va_list ap)
{
	fprintf(stderr, "error: ");
	vfprintf(stderr, fmt, ap);
	fputs(": ", stderr);
	fputs(strerror(errno), stderr);
	putc('\n', stderr);
	exit(1);
}